

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewDocPI(xmlDocPtr doc,xmlChar *name,xmlChar *content)

{
  xmlChar *pxVar1;
  _xmlDtd *p_Var2;
  xmlRegisterNodeFunc *pp_Var3;
  xmlNodePtr cur;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if (name == (xmlChar *)0x0) {
    return (xmlNodePtr)0x0;
  }
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x78);
  if (doc_local == (xmlDocPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  memset(doc_local,0,0x78);
  doc_local->type = XML_PI_NODE;
  doc_local->doc = doc;
  if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
    pxVar1 = xmlStrdup(name);
    doc_local->name = (char *)pxVar1;
  }
  else {
    pxVar1 = xmlDictLookup(doc->dict,name,-1);
    doc_local->name = (char *)pxVar1;
  }
  if ((xmlChar *)doc_local->name == (xmlChar *)0x0) {
LAB_00163177:
    xmlFreeNode((xmlNodePtr)doc_local);
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    if (content != (xmlChar *)0x0) {
      p_Var2 = (_xmlDtd *)xmlStrdup(content);
      doc_local->intSubset = p_Var2;
      if (doc_local->intSubset == (_xmlDtd *)0x0) goto LAB_00163177;
    }
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var3 = __xmlRegisterNodeDefaultValue(), *pp_Var3 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      (**pp_Var3)((xmlNodePtr)doc_local);
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlNewDocPI(xmlDocPtr doc, const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    if (name == NULL) {
	return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_PI_NODE;
    cur->doc = doc;

    if ((doc != NULL) && (doc->dict != NULL))
        cur->name = xmlDictLookup(doc->dict, name, -1);
    else
	cur->name = xmlStrdup(name);
    if (cur->name == NULL)
        goto error;
    if (content != NULL) {
	cur->content = xmlStrdup(content);
        if (cur->content == NULL)
            goto error;
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);

error:
    xmlFreeNode(cur);
    return(NULL);
}